

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

void __thiscall
CLI::RequiresError::RequiresError(RequiresError *this,string *msg,ExitCodes exit_code)

{
  undefined4 in_EDX;
  string *in_RSI;
  undefined8 *in_RDI;
  string local_70 [55];
  allocator local_39;
  string local_38 [20];
  ExitCodes in_stack_ffffffffffffffdc;
  string *in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  string *this_00;
  
  this_00 = in_RSI;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_38,"RequiresError",&local_39);
  ::std::__cxx11::string::string(local_70,in_RSI);
  ParseError::ParseError
            ((ParseError *)this_00,(string *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
             in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
  ::std::__cxx11::string::~string(local_70);
  ::std::__cxx11::string::~string(local_38);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_39);
  *in_RDI = &PTR__RequiresError_001b69d8;
  return;
}

Assistant:

RequiresError(std::string curname, std::string subname)
        : RequiresError(curname + " requires " + subname, ExitCodes::RequiresError) {}